

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_3,_3> * __thiscall
gl4cts::Math::transpose<double,3,3>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Math *this,Matrix<double,_3,_3> *matrix)

{
  Matrix<double,_3,_3> *pMVar1;
  int row_1;
  long lVar2;
  double *pdVar3;
  Math *pMVar4;
  Matrix<double,_3,_3> *result;
  int row;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar2 = 0;
  lVar5 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar2 != lVar6) {
        uVar7 = 0;
      }
      *(ulong *)((long)pdVar3 + lVar6) = (ulong)uVar7 << 0x20;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    lVar5 = lVar5 + 1;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar5 != 3);
  lVar2 = 0;
  do {
    lVar5 = 0;
    pMVar4 = this;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar5] = *(double *)pMVar4;
      lVar5 = lVar5 + 1;
      pMVar4 = pMVar4 + 0x18;
    } while (lVar5 != 3);
    lVar2 = lVar2 + 1;
    __return_storage_ptr__ = (Matrix<double,_3,_3> *)((long)__return_storage_ptr__ + 0x18);
    this = this + 8;
  } while (lVar2 != 3);
  return pMVar1;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}